

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void kratos::InsertVerilatorPublic::insert_str(Var *var)

{
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40," /*verilator public*/","");
  std::__cxx11::string::_M_assign((string *)&var->after_var_str_);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void static insert_str(Var *var) { var->set_after_var_str_(" /*verilator public*/"); }